

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * evaluate_call(dmr_C *C,expression *expr)

{
  byte bVar1;
  ptr_list *head;
  _func_int_dmr_C_ptr_expression_ptr *p_Var2;
  global_symbols_t *pgVar3;
  ulong uVar4;
  expression_list *peVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  symbol *psVar9;
  symbol *fn;
  symbol *psVar10;
  expression *peVar11;
  symbol *psVar12;
  char *pcVar13;
  expression_list *sym;
  uint uVar14;
  void **rp;
  undefined1 local_a0 [8];
  ptr_list_iter argtypeiter__;
  undefined1 local_80 [8];
  ptr_list_iter argiter__;
  ptr_list_iter expriter__;
  
  peVar11 = (expr->field_5).field_3.unop;
  head = (ptr_list *)(expr->field_5).field_2.string;
  psVar9 = dmrC_evaluate_expression(C,peVar11);
  if (psVar9 != (symbol *)0x0) {
    psVar9 = peVar11->ctype;
    cVar6 = *(char *)psVar9;
    fn = psVar9;
    if (cVar6 == '\x03') {
      fn = *(symbol **)((long)&psVar9->field_14 + 0x38);
      cVar6 = *(char *)fn;
    }
    if (cVar6 == '\x04') {
      fn = dmrC_examine_symbol_type(C->S,(fn->field_14).field_2.ctype.base_type);
      cVar6 = *(char *)fn;
    }
    if (cVar6 == '\x05') {
      examine_fn_arguments(C,fn);
      if ((((*(char *)psVar9 == '\x03') && (*(char *)peVar11 == '\t')) &&
          (psVar9->op != (symbol_op *)0x0)) &&
         (p_Var2 = psVar9->op->args, p_Var2 != (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
        iVar7 = (*p_Var2)(C,expr);
        if (iVar7 == 0) {
          return (symbol *)0x0;
        }
      }
      else {
        ptrlist_forward_iterator
                  ((ptr_list_iter *)local_a0,(ptr_list *)(fn->field_14).field_2.arguments);
        psVar10 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_a0);
        ptrlist_forward_iterator((ptr_list_iter *)&argiter__.__nr,head);
        peVar11 = (expression *)ptrlist_iter_next((ptr_list_iter *)&argiter__.__nr);
        if (peVar11 != (expression *)0x0) {
          uVar14 = 1;
          do {
            psVar12 = dmrC_evaluate_expression(C,peVar11);
            if (psVar12 == (symbol *)0x0) {
              return (symbol *)0x0;
            }
            rp = (expriter__.__head)->list_ + (int)expriter__.__list;
            if (psVar10 == (symbol *)0x0) {
              bVar1 = *(byte *)psVar12;
              if (bVar1 == 3) {
                psVar12 = *(symbol **)((long)&psVar12->field_14 + 0x38);
                bVar1 = *(byte *)psVar12;
              }
              if (bVar1 == 0xb) {
                psVar12 = dmrC_evaluate_expression(C,(psVar12->field_14).field_2.initializer);
                if (psVar12 == (symbol *)0x0) {
                  psVar12 = &C->S->bad_ctype;
                }
                else if (*(char *)psVar12 == '\x03') {
                  psVar12 = (psVar12->field_14).field_2.ctype.base_type;
                }
              }
              bVar1 = *(byte *)psVar12;
              if (bVar1 == 9) {
                psVar12 = (psVar12->field_14).field_2.ctype.base_type;
                bVar1 = *(byte *)psVar12;
              }
              if (bVar1 == 2) {
                psVar10 = (psVar12->field_14).field_2.ctype.base_type;
                pgVar3 = C->S;
                if (psVar10 == &pgVar3->int_type) {
                  iVar7 = (psVar12->field_14).field_1.normal;
LAB_0010d105:
                  if (iVar7 < C->target->bits_in_int) {
                    psVar12 = &C->S->int_ctype;
                  }
                  else {
                    uVar4 = (psVar12->field_14).field_2.ctype.modifiers;
                    if ((uVar4 & 0x300) != 0) {
                      if ((char)uVar4 < '\0') {
                        psVar12 = &C->S->uint_ctype;
                      }
                      else {
                        psVar12 = &C->S->int_ctype;
                      }
                    }
                  }
                }
                else {
                  if ((psVar10 != &pgVar3->fp_type) ||
                     ((*(byte *)((long)&psVar12->field_14 + 0x19) & 0x1c) != 0)) goto LAB_0010d1dd;
                  psVar12 = &pgVar3->double_ctype;
                }
LAB_0010d1d5:
                peVar11 = cast_to(C,peVar11,psVar12);
                *rp = peVar11;
              }
              else {
                if ((0x1a000UL >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
                  iVar7 = (psVar12->field_14).field_1.normal;
                  if (bVar1 == 0xd) {
                    psVar12 = (psVar12->field_14).field_2.ctype.base_type;
                  }
                  goto LAB_0010d105;
                }
                if (0xfffffffffffffffc < (ulong)bVar1 - 7) {
                  if (peVar11->ctype == &C->S->null_ctype) {
                    psVar12 = &C->S->ptr_ctype;
                    goto LAB_0010d1d5;
                  }
                  degenerate(C,peVar11);
                }
              }
            }
            else if ((undefined1  [136])
                     ((undefined1  [136])psVar10->field_14 & (undefined1  [136])0x200000000000000)
                     == (undefined1  [136])0x0) {
              dmrC_examine_symbol_type(C->S,psVar10);
              sprintf(evaluate_arguments_where,"argument %d",(ulong)uVar14);
              cVar6 = *(char *)psVar10;
              psVar12 = psVar10;
              if (cVar6 == '\x03') {
                psVar12 = *(symbol **)((long)&psVar10->field_14 + 0x38);
                cVar6 = *(char *)psVar12;
              }
              if (cVar6 == '\v') {
                psVar12 = dmrC_evaluate_expression(C,(psVar12->field_14).field_2.initializer);
                if (psVar12 == (symbol *)0x0) {
                  psVar12 = &C->S->bad_ctype;
                }
                else if (*(char *)psVar12 == '\x03') {
                  psVar12 = (psVar12->field_14).field_2.ctype.base_type;
                }
              }
              cVar6 = *(char *)psVar12;
              if (cVar6 == '\t') {
                psVar12 = (psVar12->field_14).field_2.ctype.base_type;
                cVar6 = *(char *)psVar12;
              }
              if ((cVar6 == '\b') &&
                 ((undefined1  [136])
                  ((undefined1  [136])psVar12->field_14 & (undefined1  [136])0x400000000000000) !=
                  (undefined1  [136])0x0)) {
                ptrlist_forward_iterator
                          ((ptr_list_iter *)local_80,
                           (ptr_list *)(psVar12->field_14).field_2.symbol_list);
                do {
                  psVar12 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_80);
                  if (psVar12 == (symbol *)0x0) goto LAB_0010d16e;
                  iVar7 = check_assignment_types
                                    (C,psVar12,(expression **)rp,(char **)&argtypeiter__.__nr);
                } while (iVar7 == 0);
              }
              else {
LAB_0010d16e:
                compatible_assignment_types
                          (C,peVar11,psVar10,(expression **)rp,evaluate_arguments_where);
              }
            }
LAB_0010d1dd:
            psVar10 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_a0);
            uVar14 = uVar14 + 1;
            peVar11 = (expression *)ptrlist_iter_next((ptr_list_iter *)&argiter__.__nr);
          } while (peVar11 != (expression *)0x0);
        }
        iVar7 = ptrlist_size((ptr_list *)(expr->field_5).field_2.string);
        iVar8 = ptrlist_size((ptr_list *)(fn->field_14).field_2.arguments);
        if (iVar7 < iVar8) {
          pcVar13 = dmrC_show_ident(C,psVar9->ident);
          dmrC_expression_error(C,expr,"not enough arguments for function %s",pcVar13);
        }
        if ((iVar8 < iVar7) &&
           ((undefined1  [136])
            ((undefined1  [136])fn->field_14 & (undefined1  [136])0x4000000000000) ==
            (undefined1  [136])0x0)) {
          pcVar13 = dmrC_show_ident(C,psVar9->ident);
          dmrC_expression_error(C,expr,"too many arguments for function %s",pcVar13);
        }
      }
      if ((*(char *)psVar9 == '\x03') && (*(char *)(expr->field_5).expr_list == '\t')) {
        peVar5 = ((expr->field_5).expr_list)->next_;
        if (((symbol_op *)peVar5->list_[4] == (symbol_op *)0x0) ||
           (p_Var2 = ((symbol_op *)peVar5->list_[4])->evaluate,
           p_Var2 == (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
          if ((*(byte *)((long)peVar5->list_ + 0x42) & 4) == 0) goto LAB_0010d311;
          psVar9 = C->current_fn;
          sym = (expression_list *)peVar5->list_[0x15];
          if ((expression_list *)peVar5->list_[0x15] == (expression_list *)0x0) {
            sym = peVar5;
          }
          C->current_fn = (symbol *)sym->list_[0xc];
          iVar7 = dmrC_inline_function(C,expr,(symbol *)sym);
          C->current_fn = psVar9;
        }
        else {
          iVar7 = (*p_Var2)(C,expr);
        }
        if (iVar7 != 0) {
          return expr->ctype;
        }
      }
LAB_0010d311:
      psVar9 = (fn->field_14).field_2.ctype.base_type;
      expr->ctype = psVar9;
      return psVar9;
    }
    pcVar13 = dmrC_show_ident(C,psVar9->ident);
    dmrC_expression_error(C,expr,"not a function %s",pcVar13);
    ptrlist_forward_iterator((ptr_list_iter *)local_80,head);
    while (peVar11 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_80),
          peVar11 != (expression *)0x0) {
      dmrC_evaluate_expression(C,peVar11);
    }
  }
  return (symbol *)0x0;
}

Assistant:

static struct symbol *evaluate_call(struct dmr_C *C, struct expression *expr)
{
	int args, fnargs;
	struct symbol *ctype, *sym;
	struct expression *fn = expr->fn;
	struct expression_list *arglist = expr->args;

	if (!dmrC_evaluate_expression(C, fn))
		return NULL;
	sym = ctype = fn->ctype;
	if (ctype->type == SYM_NODE)
		ctype = ctype->ctype.base_type;
	if (ctype->type == SYM_PTR)
		ctype = dmrC_get_base_type(C->S, ctype);

	if (ctype->type != SYM_FN) {
		struct expression *arg;
		dmrC_expression_error(C, expr, "not a function %s",
			     dmrC_show_ident(C, sym->ident));
		/* do typechecking in arguments */
		FOR_EACH_PTR (arglist, arg) {
			dmrC_evaluate_expression(C, arg);
		} END_FOR_EACH_PTR(arg);
		return NULL;
	}

	examine_fn_arguments(C, ctype);
	if (sym->type == SYM_NODE && fn->type == EXPR_PREOP &&
	    sym->op && sym->op->args) {
		if (!sym->op->args(C, expr))
			return NULL;
	} else {
		if (!evaluate_arguments(C, ctype, arglist))
			return NULL;
		args = dmrC_expression_list_size(expr->args);
		fnargs = dmrC_symbol_list_size(ctype->arguments);
		if (args < fnargs)
			dmrC_expression_error(C, expr,
				     "not enough arguments for function %s",
				     dmrC_show_ident(C, sym->ident));
		if (args > fnargs && !ctype->variadic)
			dmrC_expression_error(C, expr,
				     "too many arguments for function %s",
				     dmrC_show_ident(C, sym->ident));
	}
	if (sym->type == SYM_NODE) {
		if (evaluate_symbol_call(C, expr))
			return expr->ctype;
	}
	expr->ctype = ctype->ctype.base_type;
	return expr->ctype;
}